

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypeBindings<wabt::LocalTypes>
          (WatWriter *this,char *prefix,LocalTypes *types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name,Index binding_index_offset)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  Type type_00;
  Index IVar4;
  const_reference str;
  const_iterator cVar5;
  bool has_name;
  string *name;
  Type type;
  undefined1 local_70 [8];
  const_iterator __end0;
  undefined1 local_50 [8];
  const_iterator __begin0;
  LocalTypes *__range2;
  size_t index;
  bool prev_has_name;
  bool first;
  Index binding_index_offset_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *index_to_name_local;
  LocalTypes *types_local;
  char *prefix_local;
  WatWriter *this_local;
  
  bVar1 = true;
  index._2_1_ = 0;
  __range2 = (LocalTypes *)0x0;
  __begin0._8_8_ = types;
  cVar5 = LocalTypes::begin(types);
  __end0._8_8_ = cVar5.decl._M_current;
  __begin0.decl._M_current._0_4_ = cVar5.index;
  local_50 = (undefined1  [8])__end0._8_8_;
  cVar5 = LocalTypes::end((LocalTypes *)__begin0._8_8_);
  local_70 = (undefined1  [8])cVar5.decl._M_current;
  __end0.decl._M_current._0_4_ = cVar5.index;
  while( true ) {
    bVar2 = wabt::operator!=((const_iterator *)local_50,(const_iterator *)local_70);
    if (!bVar2) break;
    type_00 = LocalTypes::const_iterator::operator*((const_iterator *)local_50);
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](index_to_name,
                       (long)&(__range2->decls_).
                              super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                       (ulong)binding_index_offset);
    bVar3 = std::__cxx11::string::empty();
    bVar3 = (bVar3 ^ 0xff) & 1;
    if (((bVar3 != 0) || (index._2_1_ != 0)) && (!bVar1)) {
      WriteCloseSpace(this);
    }
    if (((bVar3 != 0) || (index._2_1_ != 0)) || (bVar1)) {
      WriteOpenSpace(this,prefix);
    }
    if (bVar3 != 0) {
      WriteString(this,str,Space);
    }
    WriteType(this,type_00,Space);
    bVar1 = false;
    __range2 = (LocalTypes *)
               ((long)&(__range2->decls_).
                       super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    LocalTypes::const_iterator::operator++((const_iterator *)local_50);
    index._2_1_ = bVar3;
  }
  IVar4 = LocalTypes::size(types);
  if (IVar4 != 0) {
    WriteCloseSpace(this);
  }
  return;
}

Assistant:

void WatWriter::WriteTypeBindings(const char* prefix,
                                  const T& types,
                                  const std::vector<std::string>& index_to_name,
                                  Index binding_index_offset) {
  /* named params/locals must be specified by themselves, but nameless
   * params/locals can be compressed, e.g.:
   *   (param $foo i32)
   *   (param i32 i64 f32)
   */
  bool first = true;
  bool prev_has_name = false;
  size_t index = 0;
  for (Type type : types) {
    const std::string& name = index_to_name[binding_index_offset + index];
    bool has_name = !name.empty();
    if ((has_name || prev_has_name) && !first) {
      WriteCloseSpace();
    }
    if (has_name || prev_has_name || first) {
      WriteOpenSpace(prefix);
    }
    if (has_name) {
      WriteString(name, NextChar::Space);
    }
    WriteType(type, NextChar::Space);
    prev_has_name = has_name;
    first = false;
    ++index;
  }
  if (types.size() != 0) {
    WriteCloseSpace();
  }
}